

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

xmlChar * xmlEscapeFormatString(xmlChar **msg)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((msg != (xmlChar **)0x0) && (pxVar1 = *msg, pxVar1 != (xmlChar *)0x0)) {
    uVar5 = 0;
    for (uVar4 = 0; pxVar1[uVar4] != '\0'; uVar4 = uVar4 + 1) {
      uVar5 = uVar5 + (pxVar1[uVar4] == '%');
    }
    if (uVar5 == 0) {
      return pxVar1;
    }
    if (uVar4 <= 0x7fffffff - uVar5 && uVar5 < 0x80000000) {
      pxVar1 = (xmlChar *)(*xmlMallocAtomic)(uVar4 + uVar5 + 1);
      if (pxVar1 != (xmlChar *)0x0) {
        pxVar3 = pxVar1;
        for (pxVar2 = *msg; *pxVar2 != '\0'; pxVar2 = pxVar2 + 1) {
          *pxVar3 = *pxVar2;
          if (*pxVar2 == '%') {
            pxVar3[1] = '%';
            pxVar3 = pxVar3 + 1;
          }
          pxVar3 = pxVar3 + 1;
        }
        pxVar1[uVar4 + uVar5] = '\0';
        (*xmlFree)(*msg);
        *msg = pxVar1;
        return pxVar1;
      }
      (*xmlFree)(*msg);
      *msg = (xmlChar *)0x0;
      xmlErrMemory((xmlParserCtxtPtr)0x0,(char *)0x0);
      return (xmlChar *)0x0;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlEscapeFormatString(xmlChar **msg)
{
    xmlChar *msgPtr = NULL;
    xmlChar *result = NULL;
    xmlChar *resultPtr = NULL;
    size_t count = 0;
    size_t msgLen = 0;
    size_t resultLen = 0;

    if (!msg || !*msg)
        return(NULL);

    for (msgPtr = *msg; *msgPtr != '\0'; ++msgPtr) {
        ++msgLen;
        if (*msgPtr == '%')
            ++count;
    }

    if (count == 0)
        return(*msg);

    if ((count > INT_MAX) || (msgLen > INT_MAX - count))
        return(NULL);
    resultLen = msgLen + count + 1;
    result = (xmlChar *) xmlMallocAtomic(resultLen);
    if (result == NULL) {
        /* Clear *msg to prevent format string vulnerabilities in
           out-of-memory situations. */
        xmlFree(*msg);
        *msg = NULL;
        xmlErrMemory(NULL, NULL);
        return(NULL);
    }

    for (msgPtr = *msg, resultPtr = result; *msgPtr != '\0'; ++msgPtr, ++resultPtr) {
        *resultPtr = *msgPtr;
        if (*msgPtr == '%')
            *(++resultPtr) = '%';
    }
    result[resultLen - 1] = '\0';

    xmlFree(*msg);
    *msg = result;

    return *msg;
}